

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OjaNewton.cc
# Opt level: O3

void update_wbar_and_Zx(update_data_conflict *data,float x,float *wref)

{
  int iVar1;
  ulong uVar2;
  float fVar3;
  
  iVar1 = data->ON->m;
  if (data->ON->normalize == true) {
    fVar3 = wref[(long)iVar1 + 1];
    if (fVar3 < 0.0) {
      fVar3 = sqrtf(fVar3);
    }
    else {
      fVar3 = SQRT(fVar3);
    }
    x = x / fVar3;
  }
  fVar3 = data->g;
  if (0 < iVar1) {
    uVar2 = 1;
    do {
      data->Zx[uVar2] = wref[uVar2] * x * data->ON->D[uVar2] + data->Zx[uVar2];
      uVar2 = uVar2 + 1;
    } while (iVar1 + 1 != uVar2);
  }
  *wref = *wref - (x * fVar3) / data->ON->alpha;
  return;
}

Assistant:

void update_wbar_and_Zx(update_data& data, float x, float& wref)
{
  float* w = &wref;
  int m = data.ON->m;
  if (data.ON->normalize)
    x /= sqrt(w[NORM2]);

  float g = data.g * x;

  for (int i = 1; i <= m; i++)
  {
    data.Zx[i] += w[i] * x * data.ON->D[i];
  }
  w[0] -= g / data.ON->alpha;
}